

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::free_model(Model *this)

{
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x58));
  free(*(void **)(in_RDI + 0x60));
  free(*(void **)(in_RDI + 0x68));
  if (*(long *)(in_RDI + 0x70) != 0) {
    free(*(void **)(in_RDI + 0x70));
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    free(*(void **)(in_RDI + 0x78));
  }
  if (*(long *)(in_RDI + 0x80) != 0) {
    free(*(void **)(in_RDI + 0x80));
  }
  return;
}

Assistant:

void Model::free_model() {
  free(param_w_);
#ifndef _MSC_VER
  free(param_v_);
#else
  _aligned_free(param_v_);
#endif
  free(param_b_);
  if (param_best_w_ != nullptr) {
    free(param_best_w_);
  }
  if (param_best_v_ != nullptr) {
#ifndef _MSC_VER
    free(param_best_v_);
#else
    _aligned_free(param_best_v_);
#endif
  }
  if (param_best_b_ != nullptr) {
    free(param_best_b_);
  }
}